

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall QWidgetTextControl::QWidgetTextControl(QWidgetTextControl *this,QObject *parent)

{
  long lVar1;
  QWidgetTextControlPrivate *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidgetTextControlPrivate *)operator_new(0x1b0);
  QWidgetTextControlPrivate::QWidgetTextControlPrivate(this_00);
  QInputControl::QInputControl((QInputControl *)this,TextEdit,(QObjectPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_0080d140;
  QWidgetTextControlPrivate::init(*(QWidgetTextControlPrivate **)(this + 8),(EVP_PKEY_CTX *)0x1);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QWidgetTextControl::QWidgetTextControl(QObject *parent)
    : QInputControl(QInputControl::TextEdit, *new QWidgetTextControlPrivate, parent)
{
    Q_D(QWidgetTextControl);
    d->init();
}